

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture2DShadowCase::init(Texture2DShadowCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  Texture2D *pTVar3;
  RenderContext *pRVar4;
  reference ppTVar5;
  Texture2D *pTVar6;
  PixelBufferAccess *pPVar7;
  reference ppTVar8;
  RenderTarget *pRVar9;
  size_type sVar10;
  float fVar11;
  float local_244;
  float local_238;
  Vector<float,_2> local_1b8;
  Vector<float,_2> local_1b0;
  FilterCase local_1a8;
  float local_184;
  float local_180;
  float sY;
  float sX;
  float oY;
  float oX;
  float lodY;
  float lodX;
  float ref;
  int texNdx;
  int caseNdx;
  float viewportH;
  float viewportW;
  anon_struct_24_6_1858ddf2 cases [6];
  float refOutOfBoundsLower;
  float refOutOfBoundsUpper;
  float refInRangeLower;
  float refInRangeUpper;
  exception *anon_var_0;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_a8;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_a0;
  iterator i;
  Vec4 local_90;
  RGBA local_80;
  Vec4 local_7c;
  uint local_6c;
  uint local_68;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  Vector<float,_4> local_48;
  int local_38;
  int local_34;
  int levelNdx;
  int numLevels;
  Texture2D *local_28 [3];
  Texture2DShadowCase *local_10;
  Texture2DShadowCase *this_local;
  
  local_10 = this;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(&this->m_textures,2);
  pTVar3 = (Texture2D *)operator_new(0x70);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture2D::Texture2D(pTVar3,pRVar4,this->m_format,this->m_width,this->m_height);
  local_28[0] = pTVar3;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
            (&this->m_textures,local_28);
  pTVar3 = (Texture2D *)operator_new(0x70);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture2D::Texture2D(pTVar3,pRVar4,this->m_format,this->m_width,this->m_height);
  _levelNdx = pTVar3;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
            (&this->m_textures,(value_type *)&levelNdx);
  ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                      (&this->m_textures,0);
  pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
  local_34 = tcu::TextureLevelPyramid::getNumLevels(&pTVar6->super_TextureLevelPyramid);
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,0);
    pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
    tcu::Texture2D::allocLevel(pTVar6,local_38);
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,0);
    pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
    pPVar7 = tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,local_38);
    tcu::Vector<float,_4>::Vector(&local_48,-0.5,-0.5,-0.5,2.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&step,1.0,1.0,1.0,0.0);
    tcu::fillWithComponentGradients(pPVar7,&local_48,(Vec4 *)&step);
  }
  for (rgb = 0; (int)rgb < local_34; rgb = rgb + 1) {
    colorA = (deUint32)(0xffffff / (long)local_34);
    colorB = colorA * rgb;
    local_68 = colorB | 0xff000000;
    local_6c = ~colorB | 0xff000000;
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,1);
    pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
    tcu::Texture2D::allocLevel(pTVar6,rgb);
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,1);
    pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
    pPVar7 = tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,rgb);
    tcu::RGBA::RGBA(&local_80,local_68);
    tcu::RGBA::toVec((RGBA *)&local_7c);
    tcu::RGBA::RGBA((RGBA *)((long)&i._M_current + 4),local_6c);
    tcu::RGBA::toVec((RGBA *)&local_90);
    tcu::fillWithGrid(pPVar7,4,&local_7c,&local_90);
  }
  local_a0._M_current =
       (Texture2D **)
       std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::begin(&this->m_textures);
  while( true ) {
    local_a8._M_current =
         (Texture2D **)
         std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::end(&this->m_textures);
    bVar1 = __gnu_cxx::operator!=(&local_a0,&local_a8);
    if (!bVar1) break;
    ppTVar8 = __gnu_cxx::
              __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
              ::operator*(&local_a0);
    (*(*ppTVar8)->_vptr_Texture2D[2])();
    __gnu_cxx::
    __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
    ::operator++(&local_a0,0);
  }
  bVar1 = true;
  if (this->m_compareFunc != 0x202) {
    bVar1 = this->m_compareFunc == 0x205;
  }
  local_238 = 1.0;
  if (!bVar1) {
    local_238 = 0.5;
  }
  bVar1 = true;
  if (this->m_compareFunc != 0x202) {
    bVar1 = this->m_compareFunc == 0x205;
  }
  local_244 = 0.0;
  if (!bVar1) {
    local_244 = 0.5;
  }
  cases[5].oY = 1.1;
  cases[5].oX = -0.1;
  viewportH = 0.0;
  viewportW = local_238;
  cases[0].texNdx = 0x3fcccccd;
  cases[0].ref = 2.9;
  cases[0].lodX = -1.0;
  cases[0].lodY = -2.7;
  cases[0].oX = 0.0;
  cases[0].oY = local_244;
  cases[1].texNdx = -0x40000000;
  cases[1].ref = -1.35;
  cases[1].lodX = -0.2;
  cases[1].lodY = 0.7;
  cases[1].oX = 1.4013e-45;
  cases[1].oY = local_238;
  cases[2].texNdx = 0x3e0f5c29;
  cases[2].ref = 0.275;
  cases[2].lodX = -1.5;
  cases[2].lodY = -1.1;
  cases[2].oX = 1.4013e-45;
  cases[2].oY = local_244;
  cases[3].texNdx = -0x40947ae1;
  cases[3].ref = -2.64;
  cases[3].lodX = 0.4;
  cases[3].lodY = -0.1;
  cases[3].oX = 1.4013e-45;
  cases[3].oY = 1.1;
  cases[4].texNdx = -0x413851ec;
  cases[4].ref = -0.52;
  cases[4].lodX = 0.65;
  cases[4].lodY = 0.87;
  cases[4].oX = 1.4013e-45;
  cases[4].oY = -0.1;
  cases[5].texNdx = -0x4039999a;
  cases[5].ref = 0.65;
  cases[5].lodX = 0.35;
  cases[5].lodY = 0.91;
  pRVar9 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar9);
  iVar2 = de::min<int>(0x40,iVar2);
  caseNdx = (int)(float)iVar2;
  pRVar9 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getHeight(pRVar9);
  iVar2 = de::min<int>(0x40,iVar2);
  texNdx = (int)(float)iVar2;
  for (ref = 0.0; (int)ref < 6; ref = (float)((int)ref + 1)) {
    fVar11 = (&viewportH)[(long)(int)ref * 6];
    sVar10 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::size
                       (&this->m_textures);
    lodX = (float)de::clamp<int>((int)fVar11,0,(int)sVar10 + -1);
    lodY = cases[(long)(int)ref + -1].oY;
    oX = (float)cases[(int)ref].texNdx;
    oY = cases[(int)ref].ref;
    sX = cases[(int)ref].lodX;
    sY = cases[(int)ref].lodY;
    fVar11 = deFloatExp2(oX);
    fVar11 = fVar11 * (float)caseNdx;
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)(int)lodX);
    pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
    iVar2 = tcu::Texture2D::getWidth(pTVar6);
    local_180 = fVar11 / (float)iVar2;
    fVar11 = deFloatExp2(oY);
    fVar11 = fVar11 * (float)texNdx;
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)(int)lodX);
    pTVar6 = glu::Texture2D::getRefTexture(*ppTVar5);
    iVar2 = tcu::Texture2D::getHeight(pTVar6);
    local_184 = fVar11 / (float)iVar2;
    ppTVar5 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)(int)lodX);
    fVar11 = lodY;
    pTVar3 = *ppTVar5;
    tcu::Vector<float,_2>::Vector(&local_1b0,sX,sY);
    tcu::Vector<float,_2>::Vector(&local_1b8,sX + local_180,sY + local_184);
    FilterCase::FilterCase(&local_1a8,pTVar3,fVar11,&local_1b0,&local_1b8);
    std::
    vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_1a8);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DShadowCase::init (void)
{
	try
	{
		// Create 2 textures.
		m_textures.reserve(2);
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));

		int numLevels = m_textures[0]->getRefTexture().getNumLevels();

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec(), tcu::RGBA(colorB).toVec());
		}

		// Upload.
		for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
			(*i)->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Texture2DShadowCase::deinit();
		throw;
	}

	// Compute cases.
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;		// !< lookup function should clamp values to [0, 1] range
		const float refOutOfBoundsLower	= -0.1f;

		const struct
		{
			int		texNdx;
			float	ref;
			float	lodX;
			float	lodY;
			float	oX;
			float	oY;
		} cases[] =
		{
			{ 0,	refInRangeUpper,		1.6f,	2.9f,	-1.0f,	-2.7f	},
			{ 0,	refInRangeLower,		-2.0f,	-1.35f,	-0.2f,	0.7f	},
			{ 1,	refInRangeUpper,		0.14f,	0.275f,	-1.5f,	-1.1f	},
			{ 1,	refInRangeLower,		-0.92f,	-2.64f,	0.4f,	-0.1f	},
			{ 1,	refOutOfBoundsUpper,	-0.39f,	-0.52f,	0.65f,	0.87f	},
			{ 1,	refOutOfBoundsLower,	-1.55f,	0.65f,	0.35f,	0.91f	},
		};

		const float	viewportW	= (float)de::min<int>(TEX2D_VIEWPORT_WIDTH, m_context.getRenderTarget().getWidth());
		const float	viewportH	= (float)de::min<int>(TEX2D_VIEWPORT_HEIGHT, m_context.getRenderTarget().getHeight());

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
			const float ref		= cases[caseNdx].ref;
			const float	lodX	= cases[caseNdx].lodX;
			const float	lodY	= cases[caseNdx].lodY;
			const float	oX		= cases[caseNdx].oX;
			const float	oY		= cases[caseNdx].oY;
			const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
			const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

			m_cases.push_back(FilterCase(m_textures[texNdx], ref, tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
		}
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}